

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O2

void Handler_duration_I_Inventory
               (AInventory *defaults,PClassActor *info,Baggage *bag,FPropParam *params)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  
  bVar2 = PClass::IsAncestorOf(APowerup::RegistrationInfo.MyClass,&info->super_PClass);
  lVar3 = 0x4fc;
  if (!bVar2) {
    bVar2 = PClass::IsAncestorOf(APowerupGiver::RegistrationInfo.MyClass,&info->super_PClass);
    lVar3 = 0x508;
    if (!bVar2) {
      I_Error("\"powerup.duration\" requires an actor of type \"Powerup\"\n");
      return;
    }
  }
  iVar1 = params[1].i;
  iVar4 = iVar1 * -0x23;
  if (-1 < iVar1) {
    iVar4 = iVar1;
  }
  *(int *)((long)&(defaults->super_AActor).super_DThinker.super_DObject._vptr_DObject + lVar3) =
       iVar4;
  return;
}

Assistant:

DEFINE_CLASS_PROPERTY_PREFIX(powerup, duration, I, Inventory)
{
	int *pEffectTics;

	if (info->IsDescendantOf(RUNTIME_CLASS(APowerup)))
	{
		pEffectTics = &((APowerup*)defaults)->EffectTics;
	}
	else if (info->IsDescendantOf(RUNTIME_CLASS(APowerupGiver)))
	{
		pEffectTics = &((APowerupGiver*)defaults)->EffectTics;
	}
	else
	{
		I_Error("\"powerup.duration\" requires an actor of type \"Powerup\"\n");
		return;
	}

	PROP_INT_PARM(i, 0);
	*pEffectTics = (i >= 0) ? i : -i * TICRATE;
}